

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

TRef lj_ir_tonumber(jit_State *J,TRef tr)

{
  TRef TVar1;
  
  if ((tr >> 0x18 & 0x1e) - 0xe < 6) {
    return tr;
  }
  if ((tr & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5e8e0000;
    TVar1 = lj_opt_fold(J);
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

TRef LJ_FASTCALL lj_ir_tonumber(jit_State *J, TRef tr)
{
  if (!tref_isnumber(tr)) {
    if (tref_isstr(tr))
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    else
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}